

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O2

P<r_exec::HLPBindingMap> * __thiscall
core::P<r_exec::HLPBindingMap>::operator=(P<r_exec::HLPBindingMap> *this,HLPBindingMap *c)

{
  atomic_int_fast64_t *paVar1;
  HLPBindingMap *this_00;
  
  this_00 = (HLPBindingMap *)this->object;
  if (this_00 != c) {
    if (this_00 != (HLPBindingMap *)0x0) {
      _Object::decRef((_Object *)this_00);
    }
    this->object = (_Object *)c;
    if (c != (HLPBindingMap *)0x0) {
      LOCK();
      paVar1 = &(c->super_BindingMap).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

P<C> &operator =(C *c)
    {
        if (object == c) {
            return *this;
        }

        if (object) {
            object->decRef();
        }

        object = c;

        if (object) {
            object->incRef();
        }

        return *this;
    }